

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::TestObjectMarkedBit(LargeHeapBlock *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *recycler;
  LargeObjectHeader *pHeader;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  pHeader = (LargeObjectHeader *)objectAddress;
  objectAddress_local = this;
  BVar3 = IsValidObject(this,objectAddress);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x32a,"(IsValidObject(objectAddress))","IsValidObject(objectAddress)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  recycler = (Recycler *)0x0;
  bVar2 = GetObjectHeader(this,pHeader,(LargeObjectHeader **)&recycler);
  if (bVar2) {
    this_local._7_1_ = HeapBlockMap64::IsMarked(&this->heapInfo->recycler->heapBlockMap,pHeader);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
LargeHeapBlock::TestObjectMarkedBit(void* objectAddress)
{
    Assert(IsValidObject(objectAddress));

    LargeObjectHeader* pHeader = nullptr;

    if (GetObjectHeader(objectAddress, &pHeader))
    {
        Recycler* recycler = this->heapInfo->recycler;

        return recycler->heapBlockMap.IsMarked(objectAddress);
    }

    return FALSE;
}